

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm_fpu.cpp
# Opt level: O1

void EBPLM::PredictStateOnYFace
               (Box *yebox,int ncomp,Array4<double> *Imy,Array4<double> *Ipy,Array4<const_double> *q
               ,Array4<const_double> *vmac,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc,
               bool is_velocity)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  BCRec *bcrec;
  long lVar33;
  long lVar34;
  long lVar35;
  double *pdVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  double *pdVar40;
  double *pdVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  double *pdVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  double *pdVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  double *pdVar53;
  long lVar54;
  long lVar55;
  EBCellFlag *pEVar56;
  long lVar57;
  long lVar58;
  double *pdVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  double *pdVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  double *pdVar67;
  long lVar68;
  long lVar69;
  undefined8 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  int iVar83;
  int iVar84;
  pair<bool,_bool> pVar85;
  pair<bool,_bool> pVar86;
  pair<bool,_bool> pVar87;
  int jj;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  double **ppdVar114;
  double *pdVar115;
  Long *pLVar116;
  uint uVar117;
  int iVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  long lVar122;
  long lVar123;
  long lVar124;
  long lVar125;
  long lVar126;
  long lVar127;
  int iVar128;
  long lVar129;
  long lVar130;
  int iVar131;
  int iVar132;
  long lVar133;
  long lVar134;
  double *pdVar135;
  long lVar136;
  uint uVar137;
  int iVar138;
  long lVar139;
  long lVar140;
  long lVar141;
  long lVar142;
  long lVar143;
  long lVar144;
  long lVar145;
  double *pdVar146;
  char cVar147;
  uint uVar148;
  double *pdVar149;
  double *pdVar150;
  long lVar151;
  long lVar152;
  long lVar153;
  double *pdVar154;
  double *pdVar155;
  long lVar156;
  char cVar157;
  int iVar158;
  long lVar159;
  int iVar160;
  int iVar161;
  long lVar162;
  long lVar163;
  int iVar164;
  long lVar165;
  long lVar166;
  long lVar167;
  long lVar168;
  long lVar169;
  long lVar170;
  long lVar171;
  long lVar172;
  long lVar173;
  long lVar174;
  long lVar175;
  int iVar176;
  int iVar177;
  long lVar178;
  bool bVar179;
  ulong uVar180;
  double dVar181;
  double dVar182;
  undefined1 auVar187 [16];
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar190;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar198;
  undefined1 auVar196 [16];
  double dVar195;
  double dVar199;
  undefined1 auVar197 [16];
  double dVar200;
  double dVar201;
  double dVar202;
  undefined4 uVar203;
  undefined4 uVar204;
  double dVar205;
  ulong uVar206;
  double dVar207;
  double dVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  double dVar212;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  Real delta_x;
  Real delta_z;
  Real delta_y;
  Real A [27] [3];
  Real du [27];
  double local_a98;
  double local_a68;
  double local_9f8;
  ulong local_8f8;
  long local_8f0;
  long local_8e0;
  double *local_878;
  double *local_870;
  double *local_868;
  double *local_7d8;
  double *local_7d0;
  double *local_7c8;
  double *local_720;
  double *local_718;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3e8;
  double dStack_3e0;
  double local_3c8;
  anon_class_688_19_b0541dda local_3b8;
  double adStack_108 [27];
  
  dVar181 = dt / (geom->super_CoordSys).dx[1];
  iVar176 = (geom->domain).smallend.vect[0];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar160 = (geom->domain).smallend.vect[1];
  iVar164 = (geom->domain).bigend.vect[0];
  iVar6 = (geom->domain).bigend.vect[1];
  pVar85 = anon_unknown.dwarf_673d9c::has_extdir_or_ho(bcrec,ncomp,0);
  pVar86 = anon_unknown.dwarf_673d9c::has_extdir_or_ho(bcrec,ncomp,1);
  iVar7 = (geom->domain).smallend.vect[2];
  iVar8 = (geom->domain).bigend.vect[2];
  pVar87 = anon_unknown.dwarf_673d9c::has_extdir_or_ho(bcrec,ncomp,2);
  if (((((((ushort)pVar85 & 1) == 0) || (iVar176 < (yebox->smallend).vect[0] + -1)) &&
       ((((ushort)pVar85 >> 8 & 1) == 0 || ((yebox->bigend).vect[0] < iVar164)))) &&
      (((((ushort)pVar87 & 1) == 0 || (iVar7 < (yebox->smallend).vect[2] + -1)) &&
       ((((ushort)pVar87 >> 8 & 1) == 0 || ((yebox->bigend).vect[2] < iVar8)))))) &&
     (((((ushort)pVar86 & 1) == 0 || (iVar160 < (yebox->smallend).vect[1] + -1)) &&
      ((((ushort)pVar86 >> 8 & 1) == 0 || ((yebox->bigend).vect[1] < iVar6)))))) {
    if (0 < ncomp) {
      iVar176 = (ccc->begin).y;
      iVar160 = (yebox->smallend).vect[1];
      lVar33 = ccc->jstride;
      lVar94 = (~(long)iVar176 + (long)iVar160) * lVar33;
      iVar164 = (ccc->begin).z;
      iVar6 = (yebox->smallend).vect[2];
      lVar34 = ccc->kstride;
      lVar119 = (~(long)iVar164 + (long)iVar6) * lVar34;
      lVar35 = ccc->nstride;
      iVar7 = (yebox->smallend).vect[0];
      lVar156 = (long)iVar7;
      iVar8 = (ccc->begin).x;
      lVar159 = (long)iVar8;
      pdVar36 = q->p;
      lVar37 = q->jstride;
      lVar38 = q->kstride;
      lVar39 = q->nstride;
      iVar9 = (q->begin).x;
      lVar133 = (long)iVar9;
      iVar10 = (q->begin).y;
      lVar124 = (long)iVar10;
      iVar11 = (q->begin).z;
      lVar125 = (long)iVar11;
      pdVar40 = ccc->p;
      pdVar41 = fcz->p;
      lVar42 = fcz->jstride;
      lVar43 = fcz->kstride;
      lVar44 = fcz->nstride;
      iVar12 = (fcz->begin).z;
      lVar167 = (long)(fcz->begin).y;
      lVar168 = (long)(fcz->begin).x;
      pdVar45 = fcy->p;
      lVar46 = fcy->jstride;
      lVar47 = fcy->kstride;
      lVar48 = fcy->nstride;
      iVar13 = (fcy->begin).y;
      iVar14 = (fcy->begin).z;
      lVar169 = (long)(fcy->begin).x;
      pdVar49 = fcx->p;
      lVar50 = fcx->jstride;
      lVar51 = fcx->kstride;
      lVar52 = fcx->nstride;
      iVar128 = (fcx->begin).z;
      lVar170 = (long)(fcx->begin).y;
      iVar15 = (fcx->begin).x;
      pdVar53 = vfrac->p;
      lVar54 = vfrac->jstride;
      lVar55 = vfrac->kstride;
      iVar16 = (vfrac->begin).y;
      lVar171 = (long)iVar16;
      uVar17 = (vfrac->begin).z;
      lVar172 = (long)(int)uVar17;
      uVar18 = (vfrac->begin).x;
      lVar178 = (long)(int)uVar18;
      pEVar56 = flag->p;
      lVar57 = flag->jstride;
      lVar58 = flag->kstride;
      iVar19 = (flag->begin).z;
      lVar162 = (long)(flag->begin).y;
      iVar20 = (flag->begin).x;
      pdVar59 = Ipy->p;
      lVar60 = Ipy->jstride;
      lVar61 = Ipy->kstride;
      lVar62 = Ipy->nstride;
      iVar21 = (Ipy->begin).z;
      uVar22 = (Ipy->begin).y;
      iVar23 = (Ipy->begin).x;
      pdVar63 = Imy->p;
      lVar64 = Imy->jstride;
      lVar65 = Imy->kstride;
      lVar66 = Imy->nstride;
      iVar24 = (Imy->begin).z;
      iVar25 = (Imy->begin).y;
      iVar26 = (Imy->begin).x;
      pdVar67 = vmac->p;
      lVar68 = vmac->jstride;
      lVar69 = vmac->kstride;
      iVar27 = (vmac->begin).z;
      iVar28 = (vmac->begin).y;
      lVar165 = (long)(vmac->begin).x;
      iVar29 = (yebox->bigend).vect[2];
      iVar30 = (yebox->bigend).vect[0];
      iVar31 = (yebox->bigend).vect[1];
      local_8f8 = 0;
      auVar209 = _DAT_006979b0;
      do {
        if (iVar6 <= iVar29) {
          lVar120 = local_8f8 * lVar39;
          local_8f0 = (long)iVar6;
          local_878 = pdVar40 + ((lVar35 * 2 + lVar156 + lVar94 + lVar119 + -1) - lVar159);
          local_870 = pdVar40 + ((lVar35 + lVar156 + lVar94 + lVar119 + -1) - lVar159);
          local_868 = pdVar40 + ((lVar156 + lVar94 + lVar119 + -1) - lVar159);
          do {
            if (iVar160 <= iVar31) {
              lVar95 = (local_8f0 - iVar19) * lVar58;
              lVar163 = (local_8f0 - lVar172) * lVar55;
              lVar166 = (local_8f0 - lVar125) * lVar38;
              lVar96 = (local_8f0 - iVar27) * lVar69;
              lVar129 = (local_8f0 - iVar14) * lVar47;
              lVar97 = (local_8f0 - iVar164) * lVar34;
              iVar158 = (int)local_8f0;
              iVar88 = iVar158 - iVar11;
              lVar98 = iVar88 * lVar38;
              lVar99 = ((local_8f0 + -1) - lVar172) * lVar55;
              lVar100 = ((local_8f0 + 1) - lVar172) * lVar55;
              lVar126 = ((local_8f0 + -1) - lVar125) * lVar38;
              lVar173 = ((local_8f0 + 1) - lVar125) * lVar38;
              lVar101 = (local_8f0 - iVar128) * lVar51;
              lVar127 = ((iVar158 + 1) - iVar12) * lVar43;
              lVar174 = (local_8f0 - iVar12) * lVar43;
              lVar121 = (int)(~uVar17 + iVar158) * lVar55;
              lVar102 = (int)((iVar158 + 1) - uVar17) * lVar55;
              local_7c8 = local_868;
              local_7d0 = local_870;
              local_7d8 = local_878;
              local_8e0 = (long)iVar160;
              do {
                if (iVar7 <= iVar30) {
                  lVar103 = (local_8e0 - lVar171) * lVar54;
                  lVar2 = local_8e0 + -1;
                  lVar104 = (lVar2 - lVar171) * lVar54;
                  lVar3 = local_8e0 + -2;
                  lVar105 = (lVar3 - lVar171) * lVar54;
                  lVar4 = local_8e0 + 1;
                  lVar106 = (lVar4 - lVar171) * lVar54;
                  lVar139 = (local_8e0 - lVar124) * lVar37;
                  lVar140 = (local_8e0 - iVar28) * lVar68;
                  lVar141 = (lVar2 - lVar124) * lVar37;
                  lVar142 = (lVar4 - lVar124) * lVar37;
                  lVar143 = (lVar3 - lVar124) * lVar37;
                  lVar107 = (local_8e0 - iVar13) * lVar46;
                  lVar108 = (local_8e0 - iVar176) * lVar33;
                  iVar131 = (int)local_8e0;
                  iVar89 = iVar131 - iVar10;
                  lVar109 = iVar89 * lVar37;
                  lVar152 = (local_8e0 - lVar170) * lVar50;
                  lVar153 = (local_8e0 - lVar167) * lVar42;
                  lVar134 = ((int)lVar3 - iVar10) * lVar37;
                  iVar90 = (int)lVar2 - iVar176;
                  iVar91 = (int)lVar2 - iVar10;
                  lVar110 = iVar91 * lVar37;
                  lVar111 = (lVar2 - lVar170) * lVar50;
                  lVar175 = (lVar2 - lVar167) * lVar42;
                  local_718 = local_7d0;
                  local_720 = local_7d8;
                  pdVar135 = local_7c8;
                  lVar151 = lVar156;
                  iVar5 = iVar7 - iVar9;
                  iVar83 = (iVar7 + -1) - iVar9;
                  iVar84 = (iVar7 + -1) - iVar8;
                  do {
                    lVar122 = lVar151 - iVar20;
                    uVar32 = pEVar56[lVar95 + (local_8e0 - lVar162) * lVar57 + lVar122].flag;
                    dVar182 = 0.0;
                    dVar184 = 0.0;
                    if ((short)uVar32 < 0) {
                      lVar144 = lVar151 - lVar178;
                      dVar207 = pdVar53[lVar103 + lVar144 + lVar163];
                      iVar92 = (int)lVar151;
                      if ((((dVar207 != 1.0) || (NAN(dVar207))) ||
                          (pdVar53[lVar104 + lVar163 + lVar144] != 1.0)) ||
                         (NAN(pdVar53[lVar104 + lVar163 + lVar144]))) {
LAB_00355190:
                        lVar145 = lVar151 - lVar169;
                        dVar184 = pdVar45[lVar107 + lVar129 + lVar145];
                        dVar186 = pdVar45[lVar107 + lVar129 + lVar145 + lVar48];
                        lVar112 = lVar151 - lVar159;
                        dVar195 = pdVar40[lVar97 + lVar108 + lVar112 + lVar35];
                        dVar212 = pdVar40[lVar97 + lVar108 + lVar112];
                        dVar208 = pdVar40[lVar97 + lVar108 + lVar112 + lVar35 * 2];
                        lVar136 = (long)(iVar92 - iVar9);
                        dVar185 = pdVar36[lVar109 + lVar136 + lVar98 + lVar120];
                        dVar217 = pdVar36[lVar141 + lVar98 + lVar120 + lVar136];
                        lVar123 = -1;
                        cVar147 = '\x05';
                        lVar130 = 0;
                        pdVar115 = local_720;
                        pdVar149 = pdVar135;
                        pdVar154 = local_718;
                        do {
                          lVar113 = -1;
                          pdVar146 = pdVar115;
                          pdVar150 = pdVar149;
                          pdVar155 = pdVar154;
                          cVar157 = cVar147;
                          do {
                            iVar138 = (int)lVar130;
                            ppdVar114 = &local_3b8.q.p + (long)iVar138 * 3;
                            lVar130 = 0;
                            do {
                              if (((int)lVar130 == 1 && ((int)lVar113 == 0 && (int)lVar123 == 0)) ||
                                 ((1 << (cVar157 + (char)lVar130 & 0x1fU) & uVar32) == 0)) {
                                *ppdVar114 = (double *)0x0;
                                ppdVar114[1] = (double *)0x0;
                                ppdVar114[2] = (double *)0x0;
                              }
                              else {
                                dVar182 = pdVar155[lVar130];
                                *ppdVar114 = (double *)
                                             ((pdVar150[lVar130] + (double)((int)lVar130 + -1)) -
                                             dVar212);
                                ppdVar114[1] = (double *)
                                               ((dVar182 + (double)(int)lVar113) - dVar195);
                                ppdVar114[2] = (double *)
                                               ((pdVar146[lVar130] + (double)(int)lVar123) -
                                               pdVar40[lVar97 + lVar108 + lVar112 + lVar35 * 2]);
                              }
                              lVar130 = lVar130 + 1;
                              ppdVar114 = ppdVar114 + 3;
                            } while (lVar130 != 3);
                            lVar113 = lVar113 + 1;
                            pdVar146 = pdVar146 + lVar33;
                            pdVar155 = pdVar155 + lVar33;
                            pdVar150 = pdVar150 + lVar33;
                            cVar157 = cVar157 + '\x03';
                            lVar130 = (long)iVar138 + 3;
                          } while (lVar113 != 2);
                          lVar123 = lVar123 + 1;
                          pdVar115 = pdVar115 + lVar34;
                          pdVar154 = pdVar154 + lVar34;
                          pdVar149 = pdVar149 + lVar34;
                          cVar147 = cVar147 + '\t';
                          lVar130 = (long)iVar138 + 3;
                        } while (lVar123 != 2);
                        lVar112 = -1;
                        cVar147 = '\x05';
                        lVar123 = 0;
                        do {
                          lVar130 = -1;
                          cVar157 = cVar147;
                          do {
                            iVar138 = (int)lVar123;
                            lVar123 = 0;
                            do {
                              dVar182 = 0.0;
                              if (((int)lVar123 != 1 || ((int)lVar130 != 0 || (int)lVar112 != 0)) &&
                                 ((1 << (cVar157 + (char)lVar123 & 0x1fU) & uVar32) != 0)) {
                                dVar182 = pdVar36[lVar120 + (iVar88 + (int)lVar112) * lVar38 +
                                                            (iVar89 + (int)lVar130) * lVar37 +
                                                            (long)(iVar83 + (int)lVar123)] - dVar185
                                ;
                              }
                              adStack_108[iVar138 + lVar123] = dVar182;
                              lVar123 = lVar123 + 1;
                            } while (lVar123 != 3);
                            lVar130 = lVar130 + 1;
                            cVar157 = cVar157 + '\x03';
                            lVar123 = (long)iVar138 + 3;
                          } while (lVar130 != 2);
                          lVar112 = lVar112 + 1;
                          cVar147 = cVar147 + '\t';
                          lVar123 = (long)iVar138 + 3;
                        } while (lVar112 != 2);
                        pdVar115 = &local_408;
                        lVar112 = 0;
                        do {
                          lVar123 = 0;
                          auVar187 = auVar209;
                          do {
                            if (SUB164(auVar187 ^ _DAT_006979c0,4) == -0x80000000 &&
                                SUB164(auVar187 ^ _DAT_006979c0,0) < -0x7ffffffd) {
                              *(undefined8 *)((long)pdVar115 + lVar123) = 0;
                              *(undefined8 *)((long)pdVar115 + lVar123 + 0x18) = 0;
                            }
                            lVar130 = auVar187._8_8_;
                            auVar187._0_8_ = auVar187._0_8_ + 2;
                            auVar187._8_8_ = lVar130 + 2;
                            lVar123 = lVar123 + 0x30;
                          } while (lVar123 != 0x60);
                          lVar112 = lVar112 + 1;
                          pdVar115 = pdVar115 + 1;
                        } while (lVar112 != 3);
                        dVar190 = 0.0;
                        dVar218 = 0.0;
                        dVar202 = 0.0;
                        pLVar116 = &local_3b8.q.kstride;
                        lVar112 = 0;
                        dVar182 = local_3c8;
                        dVar183 = local_408;
                        dVar216 = local_400;
                        dVar200 = local_3f8;
                        dVar191 = local_3e8;
                        dVar192 = dStack_3e0;
                        do {
                          dVar193 = (double)*pLVar116;
                          pdVar115 = ((Array4<const_double> *)(pLVar116 + -2))->p;
                          dVar215 = (double)pLVar116[-1];
                          dVar191 = dVar191 + dVar215 * (double)pLVar116[-1];
                          dVar192 = dVar192 + dVar215 * (double)*pLVar116;
                          dVar182 = dVar182 + dVar193 * dVar193;
                          dVar205 = adStack_108[lVar112];
                          dVar183 = dVar183 + (double)pdVar115 * (double)pdVar115;
                          dVar190 = dVar190 + dVar205 * (double)pdVar115;
                          dVar216 = dVar216 + dVar215 * (double)pdVar115;
                          dVar218 = dVar218 + dVar205 * dVar215;
                          dVar200 = dVar200 + dVar193 * (double)pdVar115;
                          dVar202 = dVar202 + dVar205 * dVar193;
                          lVar112 = lVar112 + 1;
                          pLVar116 = pLVar116 + 3;
                        } while (lVar112 != 0x1b);
                        dVar193 = dVar191 * dVar182 - dVar192 * dVar192;
                        dVar205 = dVar182 * dVar216 - dVar200 * dVar192;
                        dVar182 = dVar182 * dVar218 - dVar202 * dVar192;
                        dVar215 = dVar216 * dVar192 - dVar191 * dVar200;
                        local_a98 = dVar200 * dVar215 + (dVar193 * dVar183 - dVar216 * dVar205);
                        local_a68 = (dVar200 * (dVar218 * dVar192 - dVar191 * dVar202) +
                                    (dVar193 * dVar190 - dVar216 * dVar182)) / local_a98;
                        if ((dVar207 == 1.0) && (!NAN(dVar207))) {
                          if ((pdVar53[lVar103 + lVar163 + ((lVar151 + -1) - lVar178)] == 1.0) &&
                             (!NAN(pdVar53[lVar103 + lVar163 + ((lVar151 + -1) - lVar178)]))) {
                            if ((pdVar53[lVar103 + lVar163 + ((lVar151 + 1) - lVar178)] == 1.0) &&
                               (!NAN(pdVar53[lVar103 + lVar163 + ((lVar151 + 1) - lVar178)]))) {
                              dVar194 = dVar185 - pdVar36[lVar109 + lVar98 + lVar120 + ((lVar151 +
                                                                                        -1) - 
                                                  lVar133)];
                              dVar198 = pdVar36[lVar109 + lVar98 + lVar120 + ((lVar151 + 1) -
                                                                             lVar133)] - dVar185;
                              dVar194 = dVar194 + dVar194;
                              dVar198 = dVar198 + dVar198;
                              dVar193 = (pdVar36[lVar109 + lVar98 + lVar120 + ((lVar151 + 1) -
                                                                              lVar133)] -
                                        pdVar36[lVar109 + lVar98 + lVar120 + ((lVar151 + -1) -
                                                                             lVar133)]) * 0.5;
                              dVar201 = ABS(dVar194);
                              uVar180 = -(ulong)(0.0 < dVar193);
                              dVar193 = ABS(dVar193);
                              dVar219 = ABS(dVar198);
                              if (dVar201 <= dVar193) {
                                dVar193 = dVar201;
                              }
                              if (dVar193 <= dVar219) {
                                dVar219 = dVar193;
                              }
                              uVar206 = -(ulong)(0.0 < dVar194 * dVar198) & (ulong)dVar219;
                              local_a68 = (double)(~uVar180 & (uVar206 ^ 0x8000000000000000) |
                                                  uVar180 & uVar206);
                            }
                          }
                        }
                        dVar193 = dVar216 * dVar202 - dVar200 * dVar218;
                        dVar200 = (dVar200 * dVar193 + (dVar182 * dVar183 - dVar205 * dVar190)) /
                                  local_a98;
                        if ((((dVar207 == 1.0) && (!NAN(dVar207))) &&
                            (pdVar53[lVar104 + lVar163 + lVar144] == 1.0)) &&
                           (((!NAN(pdVar53[lVar104 + lVar163 + lVar144]) &&
                             (pdVar53[lVar163 + lVar106 + lVar144] == 1.0)) &&
                            (!NAN(pdVar53[lVar163 + lVar106 + lVar144]))))) {
                          dVar200 = pdVar36[lVar142 + lVar98 + lVar120 + lVar136] - dVar185;
                          dVar182 = (dVar185 - dVar217) + (dVar185 - dVar217);
                          dVar200 = dVar200 + dVar200;
                          dVar219 = (pdVar36[lVar142 + lVar98 + lVar120 + lVar136] - dVar217) * 0.5;
                          dVar194 = ABS(dVar182);
                          uVar180 = -(ulong)(0.0 < dVar219);
                          dVar219 = ABS(dVar219);
                          dVar205 = ABS(dVar200);
                          if (dVar194 <= dVar219) {
                            dVar219 = dVar194;
                          }
                          if (dVar219 <= dVar205) {
                            dVar205 = dVar219;
                          }
                          uVar206 = -(ulong)(0.0 < dVar182 * dVar200) & (ulong)dVar205;
                          dVar200 = (double)(~uVar180 & (uVar206 ^ 0x8000000000000000) |
                                            uVar180 & uVar206);
                        }
                        local_a98 = (dVar190 * dVar215 +
                                    (dVar183 * (dVar191 * dVar202 - dVar192 * dVar218) -
                                    dVar193 * dVar216)) / local_a98;
                        if (((dVar207 == 1.0) && (!NAN(dVar207))) &&
                           ((pdVar53[lVar103 + lVar144 + lVar99] == 1.0 &&
                            (((!NAN(pdVar53[lVar103 + lVar144 + lVar99]) &&
                              (pdVar53[lVar103 + lVar144 + lVar100] == 1.0)) &&
                             (!NAN(pdVar53[lVar103 + lVar144 + lVar100]))))))) {
                          dVar191 = dVar185 - pdVar36[lVar109 + lVar136 + lVar126 + lVar120];
                          dVar192 = pdVar36[lVar109 + lVar136 + lVar173 + lVar120] - dVar185;
                          dVar191 = dVar191 + dVar191;
                          dVar192 = dVar192 + dVar192;
                          dVar183 = (pdVar36[lVar109 + lVar136 + lVar173 + lVar120] -
                                    pdVar36[lVar109 + lVar136 + lVar126 + lVar120]) * 0.5;
                          dVar216 = ABS(dVar191);
                          uVar180 = -(ulong)(0.0 < dVar183);
                          dVar183 = ABS(dVar183);
                          dVar182 = ABS(dVar192);
                          if (dVar216 <= dVar183) {
                            dVar183 = dVar216;
                          }
                          if (dVar183 <= dVar182) {
                            dVar182 = dVar183;
                          }
                          uVar206 = -(ulong)(0.0 < dVar191 * dVar192) & (ulong)dVar182;
                          local_a98 = (double)(~uVar180 & (uVar206 ^ 0x8000000000000000) |
                                              uVar180 & uVar206);
                        }
                        dVar182 = dVar217;
                        if (dVar185 <= dVar217) {
                          dVar182 = dVar185;
                        }
                        if (dVar217 <= dVar185) {
                          dVar217 = dVar185;
                        }
                        iVar93 = 0;
                        iVar177 = 0;
                        iVar132 = 0;
                        iVar138 = 0;
                        uVar148 = 0xffffffff;
                        do {
                          uVar117 = uVar148 + 1;
                          uVar137 = 0xffffffff;
                          iVar161 = iVar93;
                          do {
                            uVar1 = uVar137 + 1;
                            iVar118 = 5;
                            do {
                              if (((uVar32 >> (iVar161 + iVar118 & 0x1fU) & 1) != 0) &&
                                 ((iVar118 != 6 || uVar137 != 0) || uVar148 != 0)) {
                                iVar177 = iVar177 + (uint)((iVar118 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar137 == 0 && uVar148 == 0));
                                iVar132 = iVar132 + (uint)((iVar118 == 6 && uVar148 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar138 = iVar138 + (uint)((iVar118 == 6 && uVar137 == 0) &&
                                                          (uVar117 & 0xfffffffd) == 0);
                              }
                              iVar118 = iVar118 + 1;
                            } while (iVar118 != 8);
                            iVar161 = iVar161 + 3;
                            uVar137 = uVar1;
                          } while (uVar1 != 2);
                          iVar93 = iVar93 + 9;
                          uVar148 = uVar117;
                        } while (uVar117 != 2);
                        dVar183 = 2.0;
                        if ((uVar32 >> 0x15 & 1) != 0) {
                          lVar112 = -1;
                          cVar147 = '\b';
                          dVar216 = dVar185;
                          dVar183 = dVar185;
                          do {
                            lVar123 = 0;
                            cVar157 = cVar147;
                            do {
                              lVar136 = 0;
                              do {
                                if (((int)lVar136 != 1 || ((int)lVar123 != 0 || (int)lVar112 != 0))
                                   && ((1 << (cVar157 + (char)lVar136 & 0x1fU) & uVar32) != 0)) {
                                  dVar191 = pdVar36[lVar120 + (iVar88 + (int)lVar112) * lVar38 +
                                                              (iVar89 + (int)lVar123) * lVar37 +
                                                              (long)(iVar83 + (int)lVar136)];
                                  dVar192 = dVar191;
                                  if (dVar191 <= dVar183) {
                                    dVar192 = dVar183;
                                  }
                                  dVar183 = dVar192;
                                  if (dVar191 < dVar216) {
                                    dVar216 = dVar191;
                                  }
                                }
                                lVar136 = lVar136 + 1;
                              } while (lVar136 != 3);
                              cVar157 = cVar157 + '\x03';
                              bVar179 = lVar123 == 0;
                              lVar123 = lVar123 + 1;
                            } while (bVar179);
                            lVar112 = lVar112 + 1;
                            cVar147 = cVar147 + '\t';
                          } while (lVar112 != 2);
                          dVar191 = (((pdVar45 +
                                      lVar129 + ((iVar131 + 1) - iVar13) * lVar46 + lVar145)[lVar48]
                                     - dVar208) * local_a98 +
                                    (0.5 - dVar195) * dVar200 +
                                    (pdVar45[lVar129 + ((iVar131 + 1) - iVar13) * lVar46 + lVar145]
                                    - dVar212) * local_a68 + dVar185) - dVar185;
                          if (dVar191 <= 1e-13) {
                            dVar183 = 1.0;
                            if ((dVar191 < -1e-13) &&
                               (dVar183 = (dVar216 - dVar185) / dVar191, 1.0 <= dVar183)) {
                              dVar183 = 1.0;
                            }
                          }
                          else {
                            dVar183 = (dVar183 - dVar185) / dVar191;
                            if (1.0 <= dVar183) {
                              dVar183 = 1.0;
                            }
                          }
                          if (2.0 <= dVar183) {
                            dVar183 = 2.0;
                          }
                        }
                        lVar112 = -1;
                        cVar147 = '\x05';
                        dVar191 = dVar185;
                        dVar216 = dVar185;
                        do {
                          lVar123 = -1;
                          cVar157 = cVar147;
                          do {
                            lVar136 = 0;
                            dVar192 = dVar216;
                            do {
                              dVar216 = dVar192;
                              if (((int)lVar136 != 1 || ((int)lVar123 != 0 || (int)lVar112 != 0)) &&
                                 ((1 << (cVar157 + (char)lVar136 & 0x1fU) & uVar32) != 0)) {
                                dVar190 = pdVar36[lVar120 + (iVar88 + (int)lVar112) * lVar38 +
                                                            (iVar89 + (int)lVar123) * lVar37 +
                                                            (long)(iVar83 + (int)lVar136)];
                                dVar216 = dVar190;
                                if (dVar190 <= dVar192) {
                                  dVar216 = dVar192;
                                }
                                if (dVar190 < dVar191) {
                                  dVar191 = dVar190;
                                }
                              }
                              lVar136 = lVar136 + 1;
                              dVar192 = dVar216;
                            } while (lVar136 != 3);
                            cVar157 = cVar157 + '\x03';
                            bVar179 = lVar123 != 0;
                            lVar123 = lVar123 + 1;
                          } while (bVar179);
                          lVar112 = lVar112 + 1;
                          cVar147 = cVar147 + '\t';
                        } while (lVar112 != 2);
                        dVar192 = ((dVar186 - dVar208) * local_a98 +
                                  (((dVar184 - dVar212) * local_a68 + dVar185) -
                                  (dVar195 + 0.5) * dVar200)) - dVar185;
                        if (dVar192 <= 1e-13) {
                          dVar216 = 1.0;
                          if ((dVar192 < -1e-13) &&
                             (dVar216 = (dVar191 - dVar185) / dVar192, 1.0 <= dVar216)) {
                            dVar216 = 1.0;
                          }
                        }
                        else {
                          dVar216 = (dVar216 - dVar185) / dVar192;
                          if (1.0 <= dVar216) {
                            dVar216 = 1.0;
                          }
                        }
                        if (dVar183 <= dVar216) {
                          dVar216 = dVar183;
                        }
                        dVar183 = dVar216;
                        if ((uVar32 >> 0x13 & 1) != 0) {
                          lVar112 = -1;
                          cVar147 = '\x06';
                          auVar209._8_8_ = 0;
                          auVar209._0_8_ = (ulong)dVar185;
                          dVar191 = dVar185;
                          do {
                            lVar123 = -1;
                            cVar157 = cVar147;
                            do {
                              lVar136 = 0;
                              do {
                                if ((((int)lVar123 != 0 || (int)lVar112 != 0) || (int)lVar136 != 0)
                                   && ((1 << (cVar157 + (char)lVar136 & 0x1fU) & uVar32) != 0)) {
                                  dVar183 = pdVar36[lVar120 + (iVar88 + (int)lVar112) * lVar38 +
                                                              (iVar89 + (int)lVar123) * lVar37 +
                                                              (long)(iVar5 + (int)lVar136)];
                                  uVar203 = SUB84(dVar183,0);
                                  uVar204 = (undefined4)((ulong)dVar183 >> 0x20);
                                  if (dVar183 <= auVar209._0_8_) {
                                    uVar203 = auVar209._0_4_;
                                    uVar204 = auVar209._4_4_;
                                  }
                                  if (dVar183 < dVar191) {
                                    dVar191 = dVar183;
                                  }
                                  auVar209._4_4_ = uVar204;
                                  auVar209._0_4_ = uVar203;
                                  auVar209._8_8_ = 0;
                                }
                                lVar136 = lVar136 + 1;
                              } while (lVar136 == 1);
                              lVar123 = lVar123 + 1;
                              cVar157 = cVar157 + '\x03';
                            } while (lVar123 != 2);
                            lVar112 = lVar112 + 1;
                            cVar147 = cVar147 + '\t';
                          } while (lVar112 != 2);
                          dVar192 = (((pdVar49 + lVar101 + lVar152 + ((iVar92 - iVar15) + 1))
                                      [lVar52] - dVar208) * local_a98 +
                                    (pdVar49[lVar101 + lVar152 + ((iVar92 - iVar15) + 1)] - dVar195)
                                    * dVar200 + (0.5 - dVar212) * local_a68 + dVar185) - dVar185;
                          if (dVar192 <= 1e-13) {
                            dVar183 = 1.0;
                            if ((dVar192 < -1e-13) &&
                               (dVar183 = (dVar191 - dVar185) / dVar192, 1.0 <= dVar183)) {
                              dVar183 = 1.0;
                            }
                          }
                          else {
                            dVar183 = (auVar209._0_8_ - dVar185) / dVar192;
                            if (1.0 <= dVar183) {
                              dVar183 = 1.0;
                            }
                          }
                          if (dVar216 <= dVar183) {
                            dVar183 = dVar216;
                          }
                        }
                        dVar216 = dVar183;
                        if ((uVar32 >> 0x11 & 1) != 0) {
                          lVar112 = -1;
                          cVar147 = '\x05';
                          auVar210._8_8_ = 0;
                          auVar210._0_8_ = (ulong)dVar185;
                          dVar191 = dVar185;
                          do {
                            lVar123 = -1;
                            cVar157 = cVar147;
                            do {
                              lVar136 = -1;
                              do {
                                if ((((int)lVar123 != 0 || (int)lVar112 != 0) || (int)lVar136 != 0)
                                   && ((1 << (cVar157 + (char)lVar136 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar216 = pdVar36[lVar120 + (iVar88 + (int)lVar112) * lVar38 +
                                                              (iVar89 + (int)lVar123) * lVar37 +
                                                              (long)(iVar5 + (int)lVar136)];
                                  uVar203 = SUB84(dVar216,0);
                                  uVar204 = (undefined4)((ulong)dVar216 >> 0x20);
                                  if (dVar216 <= auVar210._0_8_) {
                                    uVar203 = auVar210._0_4_;
                                    uVar204 = auVar210._4_4_;
                                  }
                                  if (dVar216 < dVar191) {
                                    dVar191 = dVar216;
                                  }
                                  auVar210._4_4_ = uVar204;
                                  auVar210._0_4_ = uVar203;
                                  auVar210._8_8_ = 0;
                                }
                                lVar136 = lVar136 + 1;
                              } while (lVar136 != 1);
                              lVar123 = lVar123 + 1;
                              cVar157 = cVar157 + '\x03';
                            } while (lVar123 != 2);
                            lVar112 = lVar112 + 1;
                            cVar147 = cVar147 + '\t';
                          } while (lVar112 != 2);
                          dVar192 = (((pdVar49 + lVar101 + lVar152 + (lVar151 - iVar15))[lVar52] -
                                     dVar208) * local_a98 +
                                    (pdVar49[lVar101 + lVar152 + (lVar151 - iVar15)] - dVar195) *
                                    dVar200 + (dVar185 - (dVar212 + 0.5) * local_a68)) - dVar185;
                          if (dVar192 <= 1e-13) {
                            dVar216 = 1.0;
                            if ((dVar192 < -1e-13) &&
                               (dVar216 = (dVar191 - dVar185) / dVar192, 1.0 <= dVar216)) {
                              dVar216 = 1.0;
                            }
                          }
                          else {
                            dVar216 = (auVar210._0_8_ - dVar185) / dVar192;
                            if (1.0 <= dVar216) {
                              dVar216 = 1.0;
                            }
                          }
                          if (dVar183 <= dVar216) {
                            dVar216 = dVar183;
                          }
                        }
                        dVar183 = dVar216;
                        if ((uVar32 >> 0x1b & 1) != 0) {
                          cVar147 = '\x0e';
                          auVar196._8_8_ = 0;
                          auVar196._0_8_ = (ulong)dVar185;
                          lVar112 = 0;
                          dVar191 = dVar185;
                          do {
                            lVar123 = -1;
                            cVar157 = cVar147;
                            do {
                              lVar136 = -1;
                              do {
                                if ((((int)lVar123 != 0 || (int)lVar112 != 0) || (int)lVar136 != 0)
                                   && ((1 << (cVar157 + (char)lVar136 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar183 = pdVar36[lVar120 + (iVar88 + (int)lVar112) * lVar38 +
                                                              (iVar89 + (int)lVar123) * lVar37 +
                                                              (long)(iVar5 + (int)lVar136)];
                                  uVar203 = SUB84(dVar183,0);
                                  uVar204 = (undefined4)((ulong)dVar183 >> 0x20);
                                  if (dVar183 <= auVar196._0_8_) {
                                    uVar203 = auVar196._0_4_;
                                    uVar204 = auVar196._4_4_;
                                  }
                                  if (dVar183 < dVar191) {
                                    dVar191 = dVar183;
                                  }
                                  auVar196._4_4_ = uVar204;
                                  auVar196._0_4_ = uVar203;
                                  auVar196._8_8_ = 0;
                                }
                                lVar136 = lVar136 + 1;
                              } while (lVar136 != 2);
                              lVar123 = lVar123 + 1;
                              cVar157 = cVar157 + '\x03';
                            } while (lVar123 != 2);
                            cVar147 = cVar147 + '\t';
                            bVar179 = lVar112 == 0;
                            lVar112 = lVar112 + 1;
                          } while (bVar179);
                          dVar192 = ((0.5 - dVar208) * local_a98 +
                                    ((pdVar41 + lVar153 + lVar127 + (lVar151 - lVar168))[lVar44] -
                                    dVar195) * dVar200 +
                                    (pdVar41[lVar153 + lVar127 + (lVar151 - lVar168)] - dVar212) *
                                    local_a68 + dVar185) - dVar185;
                          if (dVar192 <= 1e-13) {
                            dVar183 = 1.0;
                            if ((dVar192 < -1e-13) &&
                               (dVar183 = (dVar191 - dVar185) / dVar192, 1.0 <= dVar183)) {
                              dVar183 = 1.0;
                            }
                          }
                          else {
                            dVar183 = (auVar196._0_8_ - dVar185) / dVar192;
                            if (1.0 <= dVar183) {
                              dVar183 = 1.0;
                            }
                          }
                          if (dVar216 <= dVar183) {
                            dVar183 = dVar216;
                          }
                        }
                        dVar216 = dVar183;
                        if ((uVar32 >> 9 & 1) != 0) {
                          cVar147 = '\x05';
                          auVar211._8_8_ = 0;
                          auVar211._0_8_ = (ulong)dVar185;
                          lVar112 = -1;
                          dVar191 = dVar185;
                          do {
                            lVar123 = -1;
                            cVar157 = cVar147;
                            do {
                              lVar136 = -1;
                              do {
                                if ((((int)lVar123 != 0 || (int)lVar112 != 0) || (int)lVar136 != 0)
                                   && ((1 << (cVar157 + (char)lVar136 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar216 = pdVar36[lVar120 + (iVar88 + (int)lVar112) * lVar38 +
                                                              (iVar89 + (int)lVar123) * lVar37 +
                                                              (long)(iVar5 + (int)lVar136)];
                                  uVar203 = SUB84(dVar216,0);
                                  uVar204 = (undefined4)((ulong)dVar216 >> 0x20);
                                  if (dVar216 <= auVar211._0_8_) {
                                    uVar203 = auVar211._0_4_;
                                    uVar204 = auVar211._4_4_;
                                  }
                                  if (dVar216 < dVar191) {
                                    dVar191 = dVar216;
                                  }
                                  auVar211._4_4_ = uVar204;
                                  auVar211._0_4_ = uVar203;
                                  auVar211._8_8_ = 0;
                                }
                                lVar136 = lVar136 + 1;
                              } while (lVar136 != 2);
                              lVar123 = lVar123 + 1;
                              cVar157 = cVar157 + '\x03';
                            } while (lVar123 != 2);
                            cVar147 = cVar147 + '\t';
                            bVar179 = lVar112 != 0;
                            lVar112 = lVar112 + 1;
                          } while (bVar179);
                          dVar192 = ((((pdVar41 + lVar153 + lVar174 + (lVar151 - lVar168))[lVar44] -
                                      dVar195) * dVar200 +
                                     (pdVar41[lVar153 + lVar174 + (lVar151 - lVar168)] - dVar212) *
                                     local_a68 + dVar185) - (dVar208 + 0.5) * local_a98) - dVar185;
                          if (dVar192 <= 1e-13) {
                            dVar216 = 1.0;
                            if ((dVar192 < -1e-13) &&
                               (dVar216 = (dVar191 - dVar185) / dVar192, 1.0 <= dVar216)) {
                              dVar216 = 1.0;
                            }
                          }
                          else {
                            dVar216 = (auVar211._0_8_ - dVar185) / dVar192;
                            if (1.0 <= dVar216) {
                              dVar216 = 1.0;
                            }
                          }
                          if (dVar183 <= dVar216) {
                            dVar216 = dVar183;
                          }
                        }
                        dVar183 = 0.0;
                        if (1 < iVar177) {
                          dVar183 = dVar216;
                        }
                        dVar191 = 0.0;
                        if (1 < iVar132) {
                          dVar191 = dVar216;
                        }
                        dVar192 = 0.0;
                        if (1 < iVar138) {
                          dVar192 = dVar216;
                        }
                        if (((((dVar207 == 1.0) && (!NAN(dVar207))) &&
                             (pdVar53[lVar103 + lVar163 + (int)(~uVar18 + iVar92)] == 1.0)) &&
                            ((!NAN(pdVar53[lVar103 + lVar163 + (int)(~uVar18 + iVar92)]) &&
                             (pdVar53[lVar103 + lVar163 + (int)((iVar92 - uVar18) + 1)] == 1.0))))
                           && (!NAN(pdVar53[lVar103 + lVar163 + (int)((iVar92 - uVar18) + 1)]))) {
                          dVar183 = 1.0;
                        }
                        if (((dVar207 == 1.0) && (!NAN(dVar207))) &&
                           ((pdVar53[lVar104 + lVar163 + lVar144] == 1.0 &&
                            (((!NAN(pdVar53[lVar104 + lVar163 + lVar144]) &&
                              (pdVar53[lVar163 + ((iVar131 + 1) - iVar16) * lVar54 + lVar144] == 1.0
                              )) && (!NAN(pdVar53[lVar163 + ((iVar131 + 1) - iVar16) * lVar54 +
                                                            lVar144]))))))) {
                          dVar191 = 1.0;
                        }
                        if (((dVar207 == 1.0) && (!NAN(dVar207))) &&
                           (((pdVar53[lVar103 + lVar144 + lVar121] == 1.0 &&
                             ((!NAN(pdVar53[lVar103 + lVar144 + lVar121]) &&
                              (pdVar53[lVar103 + lVar144 + lVar102] == 1.0)))) &&
                            (!NAN(pdVar53[lVar103 + lVar144 + lVar102]))))) {
                          dVar192 = 1.0;
                        }
                        dVar184 = (dVar186 - dVar208) * local_a98 * dVar192 +
                                  (dVar184 - dVar212) * local_a68 * dVar183 +
                                  -(dVar195 + 0.5) * dVar200 * dVar191 + dVar185;
                        if (dVar184 <= dVar217) {
                          dVar217 = dVar184;
                        }
                        if (dVar182 <= dVar217) {
                          dVar182 = dVar217;
                        }
                        dVar182 = pdVar67[lVar140 + lVar96 + (lVar151 - lVar165)] * dVar181 * -0.5 *
                                  dVar200 * dVar191 + dVar182;
                        auVar209 = _DAT_006979b0;
                      }
                      else if (((pdVar53[lVar163 + lVar105 + lVar144] != 1.0) ||
                               (NAN(pdVar53[lVar163 + lVar105 + lVar144]))) ||
                              (((pdVar53[lVar163 + lVar106 + lVar144] != 1.0 ||
                                ((NAN(pdVar53[lVar163 + lVar106 + lVar144]) ||
                                 (pdVar53[lVar163 + ((local_8e0 + 2) - lVar171) * lVar54 + lVar144]
                                  != 1.0)))) ||
                               (NAN(pdVar53[lVar163 + ((local_8e0 + 2) - lVar171) * lVar54 + lVar144
                                           ]))))) {
                        if ((pdVar53[lVar163 + lVar106 + lVar144] != 1.0) ||
                           (NAN(pdVar53[lVar163 + lVar106 + lVar144]))) goto LAB_00355190;
                        lVar112 = lVar151 - lVar133;
                        dVar182 = pdVar36[lVar139 + lVar166 + lVar120 + lVar112];
                        dVar212 = dVar182 - pdVar36[lVar141 + lVar166 + lVar120 + lVar112];
                        dVar208 = pdVar36[lVar142 + lVar166 + lVar120 + lVar112] - dVar182;
                        dVar212 = dVar212 + dVar212;
                        dVar208 = dVar208 + dVar208;
                        dVar184 = (pdVar36[lVar142 + lVar166 + lVar120 + lVar112] -
                                  pdVar36[lVar141 + lVar166 + lVar120 + lVar112]) * 0.5;
                        dVar195 = ABS(dVar212);
                        uVar180 = -(ulong)(0.0 < dVar184);
                        dVar184 = ABS(dVar184);
                        dVar186 = ABS(dVar208);
                        if (dVar195 <= dVar184) {
                          dVar184 = dVar195;
                        }
                        if (dVar184 <= dVar186) {
                          dVar186 = dVar184;
                        }
                        uVar206 = -(ulong)(0.0 < dVar212 * dVar208) & (ulong)dVar186;
                        dVar182 = (double)(~uVar180 & (uVar206 ^ 0x8000000000000000) |
                                          uVar180 & uVar206) *
                                  (-1.0 - pdVar67[lVar140 + lVar96 + (lVar151 - lVar165)] * dVar181)
                                  * 0.5 + dVar182;
                      }
                      else {
                        lVar112 = lVar151 - lVar133;
                        dVar182 = pdVar36[lVar139 + lVar166 + lVar120 + lVar112];
                        dVar195 = dVar182 - pdVar36[lVar141 + lVar166 + lVar120 + lVar112];
                        dVar212 = pdVar36[lVar141 + lVar166 + lVar120 + lVar112] -
                                  pdVar36[lVar143 + lVar166 + lVar120 + lVar112];
                        dVar184 = 0.0;
                        dVar186 = 0.0;
                        if (0.0 <= dVar195 * dVar212) {
                          dVar186 = ABS(dVar195);
                          if (ABS(dVar212) <= ABS(dVar195)) {
                            dVar186 = ABS(dVar212);
                          }
                          dVar186 = dVar186 + dVar186;
                        }
                        dVar185 = pdVar36[lVar120 + lVar166 + ((local_8e0 + 2) - lVar124) * lVar37 +
                                                              lVar112] -
                                  pdVar36[lVar142 + lVar166 + lVar120 + lVar112];
                        dVar217 = pdVar36[lVar142 + lVar166 + lVar120 + lVar112] - dVar182;
                        dVar208 = (dVar217 + dVar185) * 0.5;
                        if (0.0 <= dVar217 * dVar185) {
                          dVar184 = ABS(dVar185);
                          if (ABS(dVar217) <= ABS(dVar185)) {
                            dVar184 = ABS(dVar217);
                          }
                          dVar184 = dVar184 + dVar184;
                        }
                        dVar183 = (dVar195 + dVar217) * 0.5;
                        dVar185 = 0.0;
                        if (0.0 <= dVar195 * dVar217) {
                          dVar185 = ABS(dVar217);
                          if (ABS(dVar195) <= ABS(dVar217)) {
                            dVar185 = ABS(dVar195);
                          }
                          dVar185 = dVar185 + dVar185;
                        }
                        dVar212 = (dVar195 + dVar212) * 0.5;
                        dVar195 = ABS(dVar212);
                        if (dVar186 <= dVar195) {
                          dVar195 = dVar186;
                        }
                        dVar186 = ABS(dVar208);
                        if (dVar184 <= dVar186) {
                          dVar186 = dVar184;
                        }
                        dVar184 = ABS(dVar183 * 1.3333333333333333 +
                                      (dVar186 * (double)((ulong)dVar208 & 0x8000000000000000 |
                                                         0x3ff0000000000000) +
                                      dVar195 * (double)((ulong)dVar212 & 0x8000000000000000 |
                                                        0x3ff0000000000000)) * -0.16666666666666666)
                        ;
                        if (dVar185 <= dVar184) {
                          dVar184 = dVar185;
                        }
                        dVar182 = dVar184 * (double)((ulong)dVar183 & 0x8000000000000000 |
                                                    0x3ff0000000000000) *
                                  (-1.0 - pdVar67[lVar140 + lVar96 + (lVar151 - lVar165)] * dVar181)
                                  * 0.5 + dVar182;
                        auVar209 = _DAT_006979b0;
                      }
                      dVar186 = pdVar53[lVar104 + lVar144 + lVar163];
                      if ((dVar186 != 1.0) || (NAN(dVar186))) {
LAB_00356e08:
                        lVar112 = lVar151 - lVar169;
                        dVar195 = pdVar45[lVar107 + lVar129 + lVar112];
                        dVar212 = (pdVar45 + lVar107 + lVar129 + lVar112)[lVar48];
                        pdVar115 = pdVar40 + (iVar158 - iVar164) * lVar34 +
                                             iVar90 * lVar33 + (iVar92 - lVar159);
                        dVar208 = pdVar115[lVar35];
                        dVar185 = *pdVar115;
                        dVar217 = pdVar115[lVar35 * 2];
                        lVar123 = (long)(iVar92 - iVar9);
                        dVar183 = pdVar36[lVar139 + lVar98 + lVar120 + lVar123];
                        dVar216 = pdVar36[lVar110 + lVar123 + lVar98 + lVar120];
                        uVar32 = pEVar56[lVar95 + (lVar2 - lVar162) * lVar57 + lVar122].flag;
                        lVar122 = -1;
                        cVar147 = '\x05';
                        lVar136 = 0;
                        do {
                          iVar138 = (int)lVar122;
                          lVar145 = -1;
                          cVar157 = cVar147;
                          do {
                            iVar93 = (int)lVar145;
                            iVar132 = (int)lVar136;
                            ppdVar114 = &local_3b8.q.p + (long)iVar132 * 3;
                            lVar136 = 0;
                            do {
                              iVar177 = (int)lVar136;
                              if ((iVar177 == 1 && (iVar93 == 0 && iVar138 == 0)) ||
                                 ((1 << (cVar157 + (char)lVar136 & 0x1fU) & uVar32) == 0)) {
                                *ppdVar114 = (double *)0x0;
                                ppdVar114[1] = (double *)0x0;
                                ppdVar114[2] = (double *)0x0;
                              }
                              else {
                                pdVar115 = pdVar40 + ((iVar158 - iVar164) + iVar138) * lVar34 +
                                                     (iVar90 + iVar93) * lVar33 +
                                                     (long)(iVar84 + iVar177);
                                dVar184 = pdVar115[lVar35];
                                *ppdVar114 = (double *)
                                             ((*pdVar115 + (double)(iVar177 + -1)) - dVar185);
                                ppdVar114[1] = (double *)((dVar184 + (double)iVar93) - dVar208);
                                ppdVar114[2] = (double *)
                                               ((pdVar115[lVar35 * 2] + (double)iVar138) - dVar217);
                              }
                              lVar136 = lVar136 + 1;
                              ppdVar114 = ppdVar114 + 3;
                            } while (lVar136 != 3);
                            lVar145 = lVar145 + 1;
                            cVar157 = cVar157 + '\x03';
                            lVar136 = (long)iVar132 + 3;
                          } while (lVar145 != 2);
                          lVar122 = lVar122 + 1;
                          cVar147 = cVar147 + '\t';
                          lVar136 = (long)iVar132 + 3;
                        } while (lVar122 != 2);
                        lVar136 = -1;
                        cVar147 = '\x05';
                        lVar122 = 0;
                        do {
                          lVar145 = -1;
                          cVar157 = cVar147;
                          do {
                            iVar138 = (int)lVar122;
                            lVar122 = 0;
                            do {
                              dVar184 = 0.0;
                              if (((int)lVar122 != 1 || ((int)lVar145 != 0 || (int)lVar136 != 0)) &&
                                 ((1 << (cVar157 + (char)lVar122 & 0x1fU) & uVar32) != 0)) {
                                dVar184 = pdVar36[lVar120 + (iVar88 + (int)lVar136) * lVar38 +
                                                            (iVar91 + (int)lVar145) * lVar37 +
                                                            (long)(iVar83 + (int)lVar122)] - dVar216
                                ;
                              }
                              adStack_108[iVar138 + lVar122] = dVar184;
                              lVar122 = lVar122 + 1;
                            } while (lVar122 != 3);
                            lVar145 = lVar145 + 1;
                            cVar157 = cVar157 + '\x03';
                            lVar122 = (long)iVar138 + 3;
                          } while (lVar145 != 2);
                          lVar136 = lVar136 + 1;
                          cVar147 = cVar147 + '\t';
                          lVar122 = (long)iVar138 + 3;
                        } while (lVar136 != 2);
                        pdVar115 = &local_408;
                        lVar122 = 0;
                        do {
                          lVar136 = 0;
                          auVar188 = auVar209;
                          do {
                            if (SUB164(auVar188 ^ _DAT_006979c0,4) == -0x80000000 &&
                                SUB164(auVar188 ^ _DAT_006979c0,0) < -0x7ffffffd) {
                              *(undefined8 *)((long)pdVar115 + lVar136) = 0;
                              *(undefined8 *)((long)pdVar115 + lVar136 + 0x18) = 0;
                            }
                            lVar145 = auVar188._8_8_;
                            auVar188._0_8_ = auVar188._0_8_ + 2;
                            auVar188._8_8_ = lVar145 + 2;
                            lVar136 = lVar136 + 0x30;
                          } while (lVar136 != 0x60);
                          lVar122 = lVar122 + 1;
                          pdVar115 = pdVar115 + 1;
                        } while (lVar122 != 3);
                        dVar218 = 0.0;
                        dVar193 = 0.0;
                        dVar205 = 0.0;
                        pLVar116 = &local_3b8.q.kstride;
                        lVar122 = 0;
                        dVar191 = local_3f8;
                        dVar192 = local_3c8;
                        dVar190 = local_408;
                        dVar184 = local_3e8;
                        dVar200 = dStack_3e0;
                        dVar202 = local_400;
                        do {
                          dVar215 = (double)*pLVar116;
                          pdVar115 = ((Array4<const_double> *)(pLVar116 + -2))->p;
                          dVar194 = (double)pLVar116[-1];
                          dVar184 = dVar184 + dVar194 * (double)pLVar116[-1];
                          dVar200 = dVar200 + dVar194 * (double)*pLVar116;
                          dVar192 = dVar192 + dVar215 * dVar215;
                          dVar219 = adStack_108[lVar122];
                          dVar190 = dVar190 + (double)pdVar115 * (double)pdVar115;
                          dVar218 = dVar218 + dVar219 * (double)pdVar115;
                          dVar202 = dVar202 + dVar194 * (double)pdVar115;
                          dVar193 = dVar193 + dVar219 * dVar194;
                          dVar191 = dVar191 + dVar215 * (double)pdVar115;
                          dVar205 = dVar205 + dVar219 * dVar215;
                          lVar122 = lVar122 + 1;
                          pLVar116 = pLVar116 + 3;
                        } while (lVar122 != 0x1b);
                        dVar219 = dVar184 * dVar192 - dVar200 * dVar200;
                        dVar215 = dVar192 * dVar202 - dVar191 * dVar200;
                        dVar192 = dVar192 * dVar193 - dVar205 * dVar200;
                        dVar194 = dVar202 * dVar200 - dVar184 * dVar191;
                        local_a98 = dVar191 * dVar194 + (dVar219 * dVar190 - dVar202 * dVar215);
                        local_9f8 = (dVar191 * (dVar193 * dVar200 - dVar184 * dVar205) +
                                    (dVar219 * dVar218 - dVar202 * dVar192)) / local_a98;
                        if ((dVar186 == 1.0) && (!NAN(dVar186))) {
                          if ((pdVar53[lVar104 + lVar163 + ((lVar151 + -1) - lVar178)] == 1.0) &&
                             (!NAN(pdVar53[lVar104 + lVar163 + ((lVar151 + -1) - lVar178)]))) {
                            if ((pdVar53[lVar104 + lVar163 + ((lVar151 + 1) - lVar178)] == 1.0) &&
                               (!NAN(pdVar53[lVar104 + lVar163 + ((lVar151 + 1) - lVar178)]))) {
                              dVar201 = dVar216 - pdVar36[lVar110 + lVar98 + lVar120 + ((lVar151 +
                                                                                        -1) - 
                                                  lVar133)];
                              dVar199 = pdVar36[lVar110 + lVar98 + lVar120 + ((lVar151 + 1) -
                                                                             lVar133)] - dVar216;
                              dVar201 = dVar201 + dVar201;
                              dVar199 = dVar199 + dVar199;
                              dVar198 = (pdVar36[lVar110 + lVar98 + lVar120 + ((lVar151 + 1) -
                                                                              lVar133)] -
                                        pdVar36[lVar110 + lVar98 + lVar120 + ((lVar151 + -1) -
                                                                             lVar133)]) * 0.5;
                              dVar220 = ABS(dVar201);
                              uVar180 = -(ulong)(0.0 < dVar198);
                              dVar198 = ABS(dVar198);
                              dVar219 = ABS(dVar199);
                              if (dVar220 <= dVar198) {
                                dVar198 = dVar220;
                              }
                              if (dVar198 <= dVar219) {
                                dVar219 = dVar198;
                              }
                              uVar206 = -(ulong)(0.0 < dVar201 * dVar199) & (ulong)dVar219;
                              local_9f8 = (double)(~uVar180 & (uVar206 ^ 0x8000000000000000) |
                                                  uVar180 & uVar206);
                            }
                          }
                        }
                        dVar219 = dVar202 * dVar205 - dVar191 * dVar193;
                        local_a68 = (dVar191 * dVar219 + (dVar192 * dVar190 - dVar215 * dVar218)) /
                                    local_a98;
                        if (((((dVar186 == 1.0) && (!NAN(dVar186))) && (dVar207 == 1.0)) &&
                            ((!NAN(dVar207) && (pdVar53[lVar163 + lVar105 + lVar144] == 1.0)))) &&
                           (!NAN(pdVar53[lVar163 + lVar105 + lVar144]))) {
                          dVar201 = dVar216 - pdVar36[lVar143 + lVar98 + lVar120 + lVar123];
                          dVar198 = (dVar183 - dVar216) + (dVar183 - dVar216);
                          dVar201 = dVar201 + dVar201;
                          dVar192 = (dVar183 - pdVar36[lVar143 + lVar98 + lVar120 + lVar123]) * 0.5;
                          dVar215 = ABS(dVar201);
                          uVar180 = -(ulong)(0.0 < dVar192);
                          dVar192 = ABS(dVar192);
                          dVar191 = ABS(dVar198);
                          if (dVar215 <= dVar192) {
                            dVar192 = dVar215;
                          }
                          if (dVar192 <= dVar191) {
                            dVar191 = dVar192;
                          }
                          uVar206 = -(ulong)(0.0 < dVar201 * dVar198) & (ulong)dVar191;
                          local_a68 = (double)(~uVar180 & (uVar206 ^ 0x8000000000000000) |
                                              uVar180 & uVar206);
                        }
                        local_a98 = (dVar218 * dVar194 +
                                    (dVar190 * (dVar184 * dVar205 - dVar200 * dVar193) -
                                    dVar219 * dVar202)) / local_a98;
                        if (((dVar186 == 1.0) && (!NAN(dVar186))) &&
                           ((pdVar53[lVar104 + lVar144 + lVar99] == 1.0 &&
                            (((!NAN(pdVar53[lVar104 + lVar144 + lVar99]) &&
                              (pdVar53[lVar104 + lVar144 + lVar100] == 1.0)) &&
                             (!NAN(pdVar53[lVar104 + lVar144 + lVar100]))))))) {
                          dVar192 = dVar216 - pdVar36[lVar110 + lVar123 + lVar126 + lVar120];
                          dVar190 = pdVar36[lVar110 + lVar123 + lVar173 + lVar120] - dVar216;
                          dVar192 = dVar192 + dVar192;
                          dVar190 = dVar190 + dVar190;
                          dVar200 = (pdVar36[lVar110 + lVar123 + lVar173 + lVar120] -
                                    pdVar36[lVar110 + lVar123 + lVar126 + lVar120]) * 0.5;
                          dVar191 = ABS(dVar192);
                          uVar180 = -(ulong)(0.0 < dVar200);
                          dVar200 = ABS(dVar200);
                          dVar184 = ABS(dVar190);
                          if (dVar191 <= dVar200) {
                            dVar200 = dVar191;
                          }
                          if (dVar200 <= dVar184) {
                            dVar184 = dVar200;
                          }
                          uVar206 = -(ulong)(0.0 < dVar192 * dVar190) & (ulong)dVar184;
                          local_a98 = (double)(~uVar180 & (uVar206 ^ 0x8000000000000000) |
                                              uVar180 & uVar206);
                        }
                        dVar184 = dVar216;
                        if (dVar183 <= dVar216) {
                          dVar184 = dVar183;
                        }
                        dVar212 = dVar212 - dVar217;
                        dVar200 = dVar216;
                        if (dVar216 <= dVar183) {
                          dVar200 = dVar183;
                        }
                        dVar195 = dVar195 - dVar185;
                        iVar93 = 0;
                        iVar138 = 0;
                        iVar132 = 0;
                        iVar177 = 0;
                        uVar148 = 0xffffffff;
                        do {
                          uVar117 = uVar148 + 1;
                          uVar137 = 0xffffffff;
                          iVar161 = iVar93;
                          do {
                            uVar1 = uVar137 + 1;
                            iVar118 = 5;
                            do {
                              if (((uVar32 >> (iVar161 + iVar118 & 0x1fU) & 1) != 0) &&
                                 ((iVar118 != 6 || uVar137 != 0) || uVar148 != 0)) {
                                iVar138 = iVar138 + (uint)((iVar118 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar137 == 0 && uVar148 == 0));
                                iVar132 = iVar132 + (uint)((iVar118 == 6 && uVar148 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar177 = iVar177 + (uint)((iVar118 == 6 && uVar137 == 0) &&
                                                          (uVar117 & 0xfffffffd) == 0);
                              }
                              iVar118 = iVar118 + 1;
                            } while (iVar118 != 8);
                            iVar161 = iVar161 + 3;
                            uVar137 = uVar1;
                          } while (uVar1 != 2);
                          iVar93 = iVar93 + 9;
                          uVar148 = uVar117;
                        } while (uVar117 != 2);
                        dVar183 = 2.0;
                        if ((uVar32 >> 0x15 & 1) != 0) {
                          lVar122 = -1;
                          cVar147 = '\b';
                          auVar189._8_8_ = 0;
                          auVar189._0_8_ = (ulong)dVar216;
                          dVar191 = dVar216;
                          do {
                            lVar123 = 0;
                            cVar157 = cVar147;
                            do {
                              lVar136 = -1;
                              do {
                                if ((((int)lVar123 != 0 || (int)lVar122 != 0) || (int)lVar136 != 0)
                                   && ((1 << (cVar157 + (char)lVar136 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar183 = pdVar36[lVar120 + (iVar88 + (int)lVar122) * lVar38 +
                                                              (iVar91 + (int)lVar123) * lVar37 +
                                                              (long)(iVar5 + (int)lVar136)];
                                  uVar203 = SUB84(dVar183,0);
                                  uVar204 = (undefined4)((ulong)dVar183 >> 0x20);
                                  if (dVar183 <= auVar189._0_8_) {
                                    uVar203 = auVar189._0_4_;
                                    uVar204 = auVar189._4_4_;
                                  }
                                  auVar189._4_4_ = uVar204;
                                  auVar189._0_4_ = uVar203;
                                  auVar189._8_8_ = 0;
                                  if (dVar183 < dVar191) {
                                    dVar191 = dVar183;
                                  }
                                }
                                lVar136 = lVar136 + 1;
                              } while (lVar136 != 2);
                              cVar157 = cVar157 + '\x03';
                              bVar179 = lVar123 == 0;
                              lVar123 = lVar123 + 1;
                            } while (bVar179);
                            lVar122 = lVar122 + 1;
                            cVar147 = cVar147 + '\t';
                          } while (lVar122 != 2);
                          dVar192 = (dVar212 * local_a98 +
                                    (0.5 - dVar208) * local_a68 + dVar195 * local_9f8 + dVar216) -
                                    dVar216;
                          if (dVar192 <= 1e-13) {
                            dVar183 = 1.0;
                            if ((dVar192 < -1e-13) &&
                               (dVar183 = (dVar191 - dVar216) / dVar192, 1.0 <= dVar183)) {
                              dVar183 = 1.0;
                            }
                          }
                          else {
                            dVar183 = (auVar189._0_8_ - dVar216) / dVar192;
                            if (1.0 <= dVar183) {
                              dVar183 = 1.0;
                            }
                          }
                          if (2.0 <= dVar183) {
                            dVar183 = 2.0;
                          }
                        }
                        dVar191 = dVar183;
                        if ((short)uVar32 < 0) {
                          lVar122 = -1;
                          cVar147 = '\x05';
                          dVar192 = dVar216;
                          dVar191 = dVar216;
                          do {
                            lVar123 = -1;
                            cVar157 = cVar147;
                            do {
                              lVar136 = -1;
                              dVar190 = dVar191;
                              do {
                                dVar191 = dVar190;
                                if ((((int)lVar123 != 0 || (int)lVar122 != 0) || (int)lVar136 != 0)
                                   && ((1 << (cVar157 + (char)lVar136 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar202 = pdVar36[lVar120 + (iVar88 + (int)lVar122) * lVar38 +
                                                              (iVar91 + (int)lVar123) * lVar37 +
                                                              (long)(iVar5 + (int)lVar136)];
                                  dVar191 = dVar202;
                                  if (dVar202 <= dVar190) {
                                    dVar191 = dVar190;
                                  }
                                  if (dVar202 < dVar192) {
                                    dVar192 = dVar202;
                                  }
                                }
                                lVar136 = lVar136 + 1;
                                dVar190 = dVar191;
                              } while (lVar136 != 2);
                              cVar157 = cVar157 + '\x03';
                              bVar179 = lVar123 != 0;
                              lVar123 = lVar123 + 1;
                            } while (bVar179);
                            lVar122 = lVar122 + 1;
                            cVar147 = cVar147 + '\t';
                          } while (lVar122 != 2);
                          dVar190 = (((pdVar45 + lVar129 + (lVar2 - iVar13) * lVar46 + lVar112)
                                      [lVar48] - dVar217) * local_a98 +
                                    (((pdVar45[lVar129 + (lVar2 - iVar13) * lVar46 + lVar112] -
                                      dVar185) * local_9f8 + dVar216) - (dVar208 + 0.5) * local_a68)
                                    ) - dVar216;
                          if (dVar190 <= 1e-13) {
                            dVar191 = 1.0;
                            if ((dVar190 < -1e-13) &&
                               (dVar191 = (dVar192 - dVar216) / dVar190, 1.0 <= dVar191)) {
                              dVar191 = 1.0;
                            }
                          }
                          else {
                            dVar191 = (dVar191 - dVar216) / dVar190;
                            if (1.0 <= dVar191) {
                              dVar191 = 1.0;
                            }
                          }
                          if (dVar183 <= dVar191) {
                            dVar191 = dVar183;
                          }
                        }
                        dVar183 = dVar191;
                        if ((uVar32 >> 0x13 & 1) != 0) {
                          lVar122 = -1;
                          cVar147 = '\x06';
                          auVar213._8_8_ = 0;
                          auVar213._0_8_ = (ulong)dVar216;
                          dVar192 = dVar216;
                          do {
                            lVar112 = -1;
                            cVar157 = cVar147;
                            do {
                              lVar123 = 0;
                              do {
                                if ((((int)lVar112 != 0 || (int)lVar122 != 0) || (int)lVar123 != 0)
                                   && ((1 << (cVar157 + (char)lVar123 & 0x1fU) & uVar32) != 0)) {
                                  dVar183 = pdVar36[lVar120 + (iVar88 + (int)lVar122) * lVar38 +
                                                              (iVar91 + (int)lVar112) * lVar37 +
                                                              (long)(iVar5 + (int)lVar123)];
                                  uVar203 = SUB84(dVar183,0);
                                  uVar204 = (undefined4)((ulong)dVar183 >> 0x20);
                                  if (dVar183 <= auVar213._0_8_) {
                                    uVar203 = auVar213._0_4_;
                                    uVar204 = auVar213._4_4_;
                                  }
                                  if (dVar183 < dVar192) {
                                    dVar192 = dVar183;
                                  }
                                  auVar213._4_4_ = uVar204;
                                  auVar213._0_4_ = uVar203;
                                  auVar213._8_8_ = 0;
                                }
                                lVar123 = lVar123 + 1;
                              } while (lVar123 == 1);
                              lVar112 = lVar112 + 1;
                              cVar157 = cVar157 + '\x03';
                            } while (lVar112 != 2);
                            lVar122 = lVar122 + 1;
                            cVar147 = cVar147 + '\t';
                          } while (lVar122 != 2);
                          dVar190 = (((pdVar49 + lVar101 + lVar111 + ((iVar92 - iVar15) + 1))
                                      [lVar52] - dVar217) * local_a98 +
                                    (pdVar49[lVar101 + lVar111 + ((iVar92 - iVar15) + 1)] - dVar208)
                                    * local_a68 + (0.5 - dVar185) * local_9f8 + dVar216) - dVar216;
                          if (dVar190 <= 1e-13) {
                            dVar183 = 1.0;
                            if ((dVar190 < -1e-13) &&
                               (dVar183 = (dVar192 - dVar216) / dVar190, 1.0 <= dVar183)) {
                              dVar183 = 1.0;
                            }
                          }
                          else {
                            dVar183 = (auVar213._0_8_ - dVar216) / dVar190;
                            if (1.0 <= dVar183) {
                              dVar183 = 1.0;
                            }
                          }
                          if (dVar191 <= dVar183) {
                            dVar183 = dVar191;
                          }
                        }
                        dVar191 = dVar183;
                        if ((uVar32 >> 0x11 & 1) != 0) {
                          lVar122 = -1;
                          cVar147 = '\x05';
                          dVar192 = dVar216;
                          dVar191 = dVar216;
                          do {
                            lVar112 = -1;
                            cVar157 = cVar147;
                            do {
                              lVar123 = -1;
                              do {
                                if ((((int)lVar112 != 0 || (int)lVar122 != 0) || (int)lVar123 != 0)
                                   && ((1 << (cVar157 + (char)lVar123 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar190 = pdVar36[lVar120 + (iVar88 + (int)lVar122) * lVar38 +
                                                              (iVar91 + (int)lVar112) * lVar37 +
                                                              (long)(iVar5 + (int)lVar123)];
                                  dVar202 = dVar190;
                                  if (dVar190 <= dVar191) {
                                    dVar202 = dVar191;
                                  }
                                  dVar191 = dVar202;
                                  if (dVar190 < dVar192) {
                                    dVar192 = dVar190;
                                  }
                                }
                                lVar123 = lVar123 + 1;
                              } while (lVar123 != 1);
                              lVar112 = lVar112 + 1;
                              cVar157 = cVar157 + '\x03';
                            } while (lVar112 != 2);
                            lVar122 = lVar122 + 1;
                            cVar147 = cVar147 + '\t';
                          } while (lVar122 != 2);
                          dVar190 = (((pdVar49 + lVar101 + lVar111 + (lVar151 - iVar15))[lVar52] -
                                     dVar217) * local_a98 +
                                    (pdVar49[lVar101 + lVar111 + (lVar151 - iVar15)] - dVar208) *
                                    local_a68 + (dVar216 - (dVar185 + 0.5) * local_9f8)) - dVar216;
                          if (dVar190 <= 1e-13) {
                            dVar191 = 1.0;
                            if ((dVar190 < -1e-13) &&
                               (dVar191 = (dVar192 - dVar216) / dVar190, 1.0 <= dVar191)) {
                              dVar191 = 1.0;
                            }
                          }
                          else {
                            dVar191 = (dVar191 - dVar216) / dVar190;
                            if (1.0 <= dVar191) {
                              dVar191 = 1.0;
                            }
                          }
                          if (dVar183 <= dVar191) {
                            dVar191 = dVar183;
                          }
                        }
                        dVar183 = dVar191;
                        if ((uVar32 >> 0x1b & 1) != 0) {
                          cVar147 = '\x0e';
                          auVar197._8_8_ = 0;
                          auVar197._0_8_ = (ulong)dVar216;
                          lVar122 = 0;
                          dVar192 = dVar216;
                          do {
                            lVar112 = -1;
                            cVar157 = cVar147;
                            do {
                              lVar123 = -1;
                              do {
                                if ((((int)lVar112 != 0 || (int)lVar122 != 0) || (int)lVar123 != 0)
                                   && ((1 << (cVar157 + (char)lVar123 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar183 = pdVar36[lVar120 + (iVar88 + (int)lVar122) * lVar38 +
                                                              (iVar91 + (int)lVar112) * lVar37 +
                                                              (long)(iVar5 + (int)lVar123)];
                                  uVar203 = SUB84(dVar183,0);
                                  uVar204 = (undefined4)((ulong)dVar183 >> 0x20);
                                  if (dVar183 <= auVar197._0_8_) {
                                    uVar203 = auVar197._0_4_;
                                    uVar204 = auVar197._4_4_;
                                  }
                                  if (dVar183 < dVar192) {
                                    dVar192 = dVar183;
                                  }
                                  auVar197._4_4_ = uVar204;
                                  auVar197._0_4_ = uVar203;
                                  auVar197._8_8_ = 0;
                                }
                                lVar123 = lVar123 + 1;
                              } while (lVar123 != 2);
                              lVar112 = lVar112 + 1;
                              cVar157 = cVar157 + '\x03';
                            } while (lVar112 != 2);
                            cVar147 = cVar147 + '\t';
                            bVar179 = lVar122 == 0;
                            lVar122 = lVar122 + 1;
                          } while (bVar179);
                          dVar190 = ((0.5 - dVar217) * local_a98 +
                                    ((pdVar41 + lVar127 + lVar175 + (lVar151 - lVar168))[lVar44] -
                                    dVar208) * local_a68 +
                                    (pdVar41[lVar127 + lVar175 + (lVar151 - lVar168)] - dVar185) *
                                    local_9f8 + dVar216) - dVar216;
                          if (dVar190 <= 1e-13) {
                            dVar183 = 1.0;
                            if ((dVar190 < -1e-13) &&
                               (dVar183 = (dVar192 - dVar216) / dVar190, 1.0 <= dVar183)) {
                              dVar183 = 1.0;
                            }
                          }
                          else {
                            dVar183 = (auVar197._0_8_ - dVar216) / dVar190;
                            if (1.0 <= dVar183) {
                              dVar183 = 1.0;
                            }
                          }
                          if (dVar191 <= dVar183) {
                            dVar183 = dVar191;
                          }
                        }
                        dVar191 = dVar183;
                        if ((uVar32 >> 9 & 1) != 0) {
                          cVar147 = '\x05';
                          auVar214._8_8_ = 0;
                          auVar214._0_8_ = (ulong)dVar216;
                          lVar122 = -1;
                          dVar192 = dVar216;
                          do {
                            lVar112 = -1;
                            cVar157 = cVar147;
                            do {
                              lVar123 = -1;
                              do {
                                if ((((int)lVar112 != 0 || (int)lVar122 != 0) || (int)lVar123 != 0)
                                   && ((1 << (cVar157 + (char)lVar123 + 1U & 0x1f) & uVar32) != 0))
                                {
                                  dVar191 = pdVar36[lVar120 + (iVar88 + (int)lVar122) * lVar38 +
                                                              (iVar91 + (int)lVar112) * lVar37 +
                                                              (long)(iVar5 + (int)lVar123)];
                                  uVar203 = SUB84(dVar191,0);
                                  uVar204 = (undefined4)((ulong)dVar191 >> 0x20);
                                  if (dVar191 <= auVar214._0_8_) {
                                    uVar203 = auVar214._0_4_;
                                    uVar204 = auVar214._4_4_;
                                  }
                                  if (dVar191 < dVar192) {
                                    dVar192 = dVar191;
                                  }
                                  auVar214._4_4_ = uVar204;
                                  auVar214._0_4_ = uVar203;
                                  auVar214._8_8_ = 0;
                                }
                                lVar123 = lVar123 + 1;
                              } while (lVar123 != 2);
                              lVar112 = lVar112 + 1;
                              cVar157 = cVar157 + '\x03';
                            } while (lVar112 != 2);
                            cVar147 = cVar147 + '\t';
                            bVar179 = lVar122 != 0;
                            lVar122 = lVar122 + 1;
                          } while (bVar179);
                          dVar185 = ((((pdVar41 + lVar174 + lVar175 + (lVar151 - lVar168))[lVar44] -
                                      dVar208) * local_a68 +
                                     (pdVar41[lVar174 + lVar175 + (lVar151 - lVar168)] - dVar185) *
                                     local_9f8 + dVar216) - (dVar217 + 0.5) * local_a98) - dVar216;
                          if (dVar185 <= 1e-13) {
                            dVar191 = 1.0;
                            if ((dVar185 < -1e-13) &&
                               (dVar191 = (dVar192 - dVar216) / dVar185, 1.0 <= dVar191)) {
                              dVar191 = 1.0;
                            }
                          }
                          else {
                            dVar191 = (auVar214._0_8_ - dVar216) / dVar185;
                            if (1.0 <= dVar191) {
                              dVar191 = 1.0;
                            }
                          }
                          if (dVar183 <= dVar191) {
                            dVar191 = dVar183;
                          }
                        }
                        dVar185 = 0.0;
                        if (1 < iVar138) {
                          dVar185 = dVar191;
                        }
                        uVar203 = 0;
                        uVar204 = 0;
                        if (1 < iVar132) {
                          uVar203 = SUB84(dVar191,0);
                          uVar204 = (undefined4)((ulong)dVar191 >> 0x20);
                        }
                        dVar217 = 0.0;
                        if (1 < iVar177) {
                          dVar217 = dVar191;
                        }
                        if ((((dVar186 == 1.0) && (!NAN(dVar186))) &&
                            (pdVar53[lVar104 + lVar163 + (int)(~uVar18 + iVar92)] == 1.0)) &&
                           (((!NAN(pdVar53[lVar104 + lVar163 + (int)(~uVar18 + iVar92)]) &&
                             (pdVar53[lVar104 + lVar163 + (int)((iVar92 - uVar18) + 1)] == 1.0)) &&
                            (!NAN(pdVar53[lVar104 + lVar163 + (int)((iVar92 - uVar18) + 1)]))))) {
                          dVar185 = 1.0;
                        }
                        if (((dVar186 == 1.0) && (!NAN(dVar186))) &&
                           ((dVar207 == 1.0 &&
                            (((!NAN(dVar207) &&
                              (pdVar53[lVar163 + ((iVar131 - iVar16) + -2) * lVar54 + lVar144] ==
                               1.0)) &&
                             (!NAN(pdVar53[lVar163 + ((iVar131 - iVar16) + -2) * lVar54 + lVar144]))
                             ))))) {
                          uVar203 = 0;
                          uVar204 = 0x3ff00000;
                        }
                        if (((dVar186 == 1.0) && (!NAN(dVar186))) &&
                           (((pdVar53[lVar104 + lVar144 + lVar121] == 1.0 &&
                             ((!NAN(pdVar53[lVar104 + lVar144 + lVar121]) &&
                              (pdVar53[lVar104 + lVar144 + lVar102] == 1.0)))) &&
                            (!NAN(pdVar53[lVar104 + lVar144 + lVar102]))))) {
                          dVar217 = 1.0;
                        }
                        local_a68 = local_a68 * (double)CONCAT44(uVar204,uVar203);
                        dVar207 = dVar212 * local_a98 * dVar217 +
                                  (0.5 - dVar208) * local_a68 +
                                  dVar195 * local_9f8 * dVar185 + dVar216;
                        if (dVar207 <= dVar200) {
                          dVar200 = dVar207;
                        }
                        if (dVar184 <= dVar200) {
                          dVar184 = dVar200;
                        }
                        dVar184 = pdVar67[lVar140 + lVar96 + (lVar151 - lVar165)] * dVar181 * -0.5 *
                                  local_a68 + dVar184;
                        auVar209 = _DAT_006979b0;
                      }
                      else {
                        dVar184 = pdVar53[lVar163 + ((int)lVar3 - iVar16) * lVar54 + lVar144];
                        if (((dVar184 != 1.0) ||
                            (((NAN(dVar184) || (dVar207 != 1.0)) || (NAN(dVar207))))) ||
                           ((((pdVar53[lVar163 + ((iVar131 + -3) - iVar16) * lVar54 + lVar144] !=
                               1.0 || (NAN(pdVar53[lVar163 + ((iVar131 + -3) - iVar16) * lVar54 +
                                                             lVar144]))) ||
                             (pdVar53[lVar163 + ((int)lVar4 - iVar16) * lVar54 + lVar144] != 1.0))
                            || (NAN(pdVar53[lVar163 + ((int)lVar4 - iVar16) * lVar54 + lVar144])))))
                        {
                          if (((dVar207 != 1.0) || (NAN(dVar207))) ||
                             ((dVar184 != 1.0 || (NAN(dVar184))))) goto LAB_00356e08;
                          lVar122 = lVar151 - lVar133;
                          dVar184 = pdVar36[lVar141 + lVar166 + lVar120 + lVar122];
                          dVar195 = dVar184 - pdVar36[lVar120 + lVar166 + lVar134 + lVar122];
                          dVar212 = pdVar36[lVar139 + lVar166 + lVar120 + lVar122] - dVar184;
                          dVar195 = dVar195 + dVar195;
                          dVar212 = dVar212 + dVar212;
                          dVar207 = (pdVar36[lVar139 + lVar166 + lVar120 + lVar122] -
                                    pdVar36[lVar120 + lVar166 + lVar134 + lVar122]) * 0.5;
                          dVar208 = ABS(dVar195);
                          uVar180 = -(ulong)(0.0 < dVar207);
                          dVar207 = ABS(dVar207);
                          dVar186 = ABS(dVar212);
                          if (dVar208 <= dVar207) {
                            dVar207 = dVar208;
                          }
                          if (dVar207 <= dVar186) {
                            dVar186 = dVar207;
                          }
                          uVar206 = -(ulong)(0.0 < dVar195 * dVar212) & (ulong)dVar186;
                          dVar184 = (double)(~uVar180 & (uVar206 ^ 0x8000000000000000) |
                                            uVar180 & uVar206) *
                                    (1.0 - pdVar67[lVar140 + lVar96 + (lVar151 - lVar165)] * dVar181
                                    ) * 0.5 + dVar184;
                        }
                        else {
                          lVar122 = lVar151 - lVar133;
                          dVar184 = pdVar36[lVar141 + lVar166 + lVar120 + lVar122];
                          dVar195 = dVar184 - pdVar36[lVar120 + lVar166 + lVar134 + lVar122];
                          dVar212 = pdVar36[lVar120 + lVar166 + lVar134 + lVar122] -
                                    pdVar36[lVar120 + lVar166 + ((iVar131 + -3) - iVar10) * lVar37 +
                                                                lVar122];
                          dVar186 = 0.0;
                          dVar207 = 0.0;
                          if (0.0 <= dVar195 * dVar212) {
                            dVar207 = ABS(dVar195);
                            if (ABS(dVar212) <= ABS(dVar195)) {
                              dVar207 = ABS(dVar212);
                            }
                            dVar207 = dVar207 + dVar207;
                          }
                          dVar185 = pdVar36[lVar120 + lVar166 + ((int)lVar4 - iVar10) * lVar37 +
                                                                lVar122] -
                                    pdVar36[lVar139 + lVar166 + lVar120 + lVar122];
                          dVar217 = pdVar36[lVar139 + lVar166 + lVar120 + lVar122] - dVar184;
                          dVar208 = (dVar217 + dVar185) * 0.5;
                          if (0.0 <= dVar217 * dVar185) {
                            dVar186 = ABS(dVar185);
                            if (ABS(dVar217) <= ABS(dVar185)) {
                              dVar186 = ABS(dVar217);
                            }
                            dVar186 = dVar186 + dVar186;
                          }
                          dVar183 = (dVar195 + dVar217) * 0.5;
                          dVar185 = 0.0;
                          if (0.0 <= dVar195 * dVar217) {
                            dVar185 = ABS(dVar217);
                            if (ABS(dVar195) <= ABS(dVar217)) {
                              dVar185 = ABS(dVar195);
                            }
                            dVar185 = dVar185 + dVar185;
                          }
                          dVar212 = (dVar195 + dVar212) * 0.5;
                          dVar195 = ABS(dVar212);
                          if (dVar207 <= dVar195) {
                            dVar195 = dVar207;
                          }
                          dVar207 = ABS(dVar208);
                          if (dVar186 <= dVar207) {
                            dVar207 = dVar186;
                          }
                          dVar207 = ABS(dVar183 * 1.3333333333333333 +
                                        (dVar207 * (double)((ulong)dVar208 & 0x8000000000000000 |
                                                           0x3ff0000000000000) +
                                        dVar195 * (double)((ulong)dVar212 & 0x8000000000000000 |
                                                          0x3ff0000000000000)) *
                                        -0.16666666666666666);
                          if (dVar185 <= dVar207) {
                            dVar207 = dVar185;
                          }
                          dVar184 = dVar207 * (double)((ulong)dVar183 & 0x8000000000000000 |
                                                      0x3ff0000000000000) *
                                    (1.0 - pdVar67[lVar140 + lVar96 + (lVar151 - lVar165)] * dVar181
                                    ) * 0.5 + dVar184;
                          auVar209 = _DAT_006979b0;
                        }
                      }
                    }
                    pdVar59[local_8f8 * lVar62 +
                            (local_8f0 - iVar21) * lVar61 +
                            (int)(iVar131 + ~uVar22) * lVar60 + (lVar151 - iVar23)] = dVar184;
                    pdVar63[local_8f8 * lVar66 +
                            (local_8f0 - iVar24) * lVar65 +
                            (local_8e0 - iVar25) * lVar64 + (lVar151 - iVar26)] = dVar182;
                    lVar151 = lVar151 + 1;
                    local_720 = local_720 + 1;
                    local_718 = local_718 + 1;
                    pdVar135 = pdVar135 + 1;
                    iVar83 = iVar83 + 1;
                    iVar5 = iVar5 + 1;
                    iVar84 = iVar84 + 1;
                  } while (iVar30 + 1 != (int)lVar151);
                }
                local_8e0 = local_8e0 + 1;
                local_7d8 = local_7d8 + lVar33;
                local_7d0 = local_7d0 + lVar33;
                local_7c8 = local_7c8 + lVar33;
              } while (iVar31 + 1 != (int)local_8e0);
            }
            local_8f0 = local_8f0 + 1;
            local_878 = local_878 + lVar34;
            local_870 = local_870 + lVar34;
            local_868 = local_868 + lVar34;
          } while (iVar29 + 1 != (int)local_8f0);
        }
        local_8f8 = local_8f8 + 1;
      } while (local_8f8 != (uint)ncomp);
    }
  }
  else {
    local_3b8.q.p = q->p;
    local_3b8.q.jstride = q->jstride;
    local_3b8.q.kstride = q->kstride;
    local_3b8.q.nstride = q->nstride;
    local_3b8.q.begin.x = (q->begin).x;
    local_3b8.q.begin.y = (q->begin).y;
    uVar70 = *(undefined8 *)&(q->begin).z;
    uVar71 = (q->end).y;
    local_3b8.q._52_8_ = *(undefined8 *)&(q->end).z;
    local_3b8.q.begin.z = (int)uVar70;
    local_3b8.q.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.vmac.p = vmac->p;
    local_3b8.vmac.jstride = vmac->jstride;
    local_3b8.vmac.kstride = vmac->kstride;
    local_3b8.vmac.nstride = vmac->nstride;
    local_3b8.vmac.begin.x = (vmac->begin).x;
    local_3b8.vmac.begin.y = (vmac->begin).y;
    uVar72 = (vmac->end).x;
    uVar73 = (vmac->end).y;
    local_3b8.vmac._52_8_ = *(undefined8 *)&(vmac->end).z;
    local_3b8.vmac.begin.z = (int)*(undefined8 *)&(vmac->begin).z;
    local_3b8.Imy.p = Imy->p;
    local_3b8.Imy.jstride = Imy->jstride;
    local_3b8.Imy.kstride = Imy->kstride;
    local_3b8.Imy.nstride = Imy->nstride;
    local_3b8.Imy.begin.x = (Imy->begin).x;
    local_3b8.Imy.begin.y = (Imy->begin).y;
    uVar70 = *(undefined8 *)&(Imy->begin).z;
    uVar74 = (Imy->end).y;
    local_3b8.Imy._52_8_ = *(undefined8 *)&(Imy->end).z;
    local_3b8.Imy.begin.z = (int)uVar70;
    local_3b8.Imy.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.Ipy.p = Ipy->p;
    local_3b8.Ipy.jstride = Ipy->jstride;
    local_3b8.Ipy.kstride = Ipy->kstride;
    local_3b8.Ipy.nstride = Ipy->nstride;
    local_3b8.Ipy.begin.x = (Ipy->begin).x;
    local_3b8.Ipy.begin.y = (Ipy->begin).y;
    uVar75 = (Ipy->end).x;
    uVar76 = (Ipy->end).y;
    local_3b8.Ipy._52_8_ = *(undefined8 *)&(Ipy->end).z;
    local_3b8.Ipy.begin.z = (int)*(undefined8 *)&(Ipy->begin).z;
    local_3b8.pbc = pbc;
    local_3b8.flag.p = flag->p;
    local_3b8.flag.jstride = flag->jstride;
    local_3b8.flag.kstride = flag->kstride;
    local_3b8.flag.nstride = flag->nstride;
    local_3b8.flag.begin.x = (flag->begin).x;
    local_3b8.flag.begin.y = (flag->begin).y;
    uVar70 = *(undefined8 *)&(flag->begin).z;
    uVar77 = (flag->end).y;
    local_3b8.flag._52_8_ = *(undefined8 *)&(flag->end).z;
    local_3b8.flag.begin.z = (int)uVar70;
    local_3b8.flag.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.vfrac.p = vfrac->p;
    local_3b8.vfrac.jstride = vfrac->jstride;
    local_3b8.vfrac.kstride = vfrac->kstride;
    local_3b8.vfrac.nstride = vfrac->nstride;
    local_3b8.vfrac.begin.x = (vfrac->begin).x;
    local_3b8.vfrac.begin.y = (vfrac->begin).y;
    uVar70 = *(undefined8 *)&(vfrac->begin).z;
    uVar78 = (vfrac->end).y;
    local_3b8.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
    local_3b8.vfrac.begin.z = (int)uVar70;
    local_3b8.vfrac.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.ccc.p = ccc->p;
    local_3b8.ccc.jstride = ccc->jstride;
    local_3b8.ccc.kstride = ccc->kstride;
    local_3b8.ccc.nstride = ccc->nstride;
    local_3b8.ccc.begin.x = (ccc->begin).x;
    local_3b8.ccc.begin.y = (ccc->begin).y;
    uVar70 = *(undefined8 *)&(ccc->begin).z;
    uVar79 = (ccc->end).y;
    local_3b8.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
    local_3b8.ccc.begin.z = (int)uVar70;
    local_3b8.ccc.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.fcx.p = fcx->p;
    local_3b8.fcx.jstride = fcx->jstride;
    local_3b8.fcx.kstride = fcx->kstride;
    local_3b8.fcx.nstride = fcx->nstride;
    local_3b8.fcx.begin.x = (fcx->begin).x;
    local_3b8.fcx.begin.y = (fcx->begin).y;
    uVar70 = *(undefined8 *)&(fcx->begin).z;
    uVar80 = (fcx->end).y;
    local_3b8.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
    local_3b8.fcx.begin.z = (int)uVar70;
    local_3b8.fcx.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.fcy.p = fcy->p;
    local_3b8.fcy.jstride = fcy->jstride;
    local_3b8.fcy.kstride = fcy->kstride;
    local_3b8.fcy.nstride = fcy->nstride;
    local_3b8.fcy.begin.x = (fcy->begin).x;
    local_3b8.fcy.begin.y = (fcy->begin).y;
    uVar70 = *(undefined8 *)&(fcy->begin).z;
    uVar81 = (fcy->end).y;
    local_3b8.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
    local_3b8.fcy.begin.z = (int)uVar70;
    local_3b8.fcy.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.fcz.p = fcz->p;
    local_3b8.fcz.jstride = fcz->jstride;
    local_3b8.fcz.kstride = fcz->kstride;
    local_3b8.fcz.nstride = fcz->nstride;
    local_3b8.fcz.begin.x = (fcz->begin).x;
    local_3b8.fcz.begin.y = (fcz->begin).y;
    uVar70 = *(undefined8 *)&(fcz->begin).z;
    uVar82 = (fcz->end).y;
    local_3b8.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
    local_3b8.fcz.begin.z = (int)uVar70;
    local_3b8.fcz.end.x = (int)((ulong)uVar70 >> 0x20);
    local_3b8.is_velocity = is_velocity;
    if (0 < ncomp) {
      iVar9 = (yebox->smallend).vect[0];
      iVar10 = (yebox->smallend).vect[1];
      iVar11 = (yebox->smallend).vect[2];
      iVar12 = (yebox->bigend).vect[2];
      iVar13 = (yebox->bigend).vect[0];
      iVar14 = (yebox->bigend).vect[1];
      iVar128 = 0;
      local_3b8.q.end.y = uVar71;
      local_3b8.vmac.end.x = uVar72;
      local_3b8.vmac.end.y = uVar73;
      local_3b8.domain_ilo = iVar176;
      local_3b8.domain_jlo = iVar160;
      local_3b8.domain_klo = iVar7;
      local_3b8.domain_ihi = iVar164;
      local_3b8.domain_jhi = iVar6;
      local_3b8.domain_khi = iVar8;
      local_3b8.Imy.end.y = uVar74;
      local_3b8.Ipy.end.x = uVar75;
      local_3b8.Ipy.end.y = uVar76;
      local_3b8.dtdy = dVar181;
      local_3b8.flag.end.y = uVar77;
      local_3b8.vfrac.end.y = uVar78;
      local_3b8.ccc.end.y = uVar79;
      local_3b8.fcx.end.y = uVar80;
      local_3b8.fcy.end.y = uVar81;
      local_3b8.fcz.end.y = uVar82;
      do {
        iVar176 = iVar11;
        if (iVar11 <= iVar12) {
          do {
            iVar160 = iVar10;
            if (iVar10 <= iVar14) {
              do {
                iVar164 = iVar9;
                if (iVar9 <= iVar13) {
                  do {
                    PredictStateOnYFace::anon_class_688_19_b0541dda::operator()
                              (&local_3b8,iVar164,iVar160,iVar176,iVar128);
                    iVar164 = iVar164 + 1;
                  } while (iVar13 + 1 != iVar164);
                }
                bVar179 = iVar160 != iVar14;
                iVar160 = iVar160 + 1;
              } while (bVar179);
            }
            bVar179 = iVar176 != iVar12;
            iVar176 = iVar176 + 1;
          } while (bVar179);
        }
        iVar128 = iVar128 + 1;
      } while (iVar128 != ncomp);
    }
  }
  return;
}

Assistant:

void
EBPLM::PredictStateOnYFace ( Box const& yebox, int ncomp,
                             Array4<Real> const& Imy, Array4<Real> const& Ipy,
                             Array4<Real const> const& q,
                             Array4<Real const> const& vmac,
                             Array4<EBCellFlag const> const& flag,
                             Array4<Real const> const& vfrac,
                             AMREX_D_DECL(Array4<Real const> const& fcx,
                                          Array4<Real const> const& fcy,
                                          Array4<Real const> const& fcz),
                             Array4<Real const> const& ccc,
                             Geometry const& geom,
                             Real dt,
                             Vector<BCRec> const& h_bcrec,
                             BCRec const* pbc, bool is_velocity)
{
    const Real dy = geom.CellSize(1);
    const Real dtdy = dt/dy;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::y));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= yebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= yebox.bigEnd(0)    ) ||
#if (AMREX_SPACEDIM == 3)
         (has_extdir_or_ho_lo_z && domain_klo >= yebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= yebox.bigEnd(2)    ) ||
#endif
         (has_extdir_or_ho_lo_y && domain_jlo >= yebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= yebox.bigEnd(1)    )  )
    {
        amrex::ParallelFor(yebox, ncomp, [q,vmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apy(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);
#endif

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                          vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 + ccc(i,j,k,1);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_z = zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_hi[1];

                }  // end of making qpls

                // Only over-write normal velocity with Dirichlet bc at lo face
                if (j == domain_jlo && (bc.lo(1) == BCType::ext_dir))
                    if (is_velocity && n == 1) qpls = q(i,j-1,k,n);

                // Over-write all with Dirichlet bc at hi face
                if (j == domain_jhi+1 && (bc.hi(1) == BCType::ext_dir))
                    qpls = q(i,j,k,n);

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                            vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                Real delta_x = xf  - ccc(i,j-1,k,0);,
                                Real delta_z = zf  - ccc(i,j-1,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j-1,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);


#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_lo[1];

                }  // end of making qmns

                // Over-write all with Dirichlet bc at lo face
                if (j == domain_jlo && (bc.lo(1) == BCType::ext_dir))
                    qmns = q(i,j-1,k,n);

                // Only over-write normal velocity with Dirichlet bc at hi face
                if (j == domain_jhi+1 && (bc.hi(1) == BCType::ext_dir))
                    if (is_velocity && n == 1) qmns = q(i,j,k,n);
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(yebox, ncomp, [q,vmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dt,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apy(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                          vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 + ccc(i,j,k,1);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_z = zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_hi[1];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                            vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                Real delta_x = xf  - ccc(i,j-1,k,0);,
                                Real delta_z = zf  - ccc(i,j-1,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j-1,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_lo[1];

                }  // end of making qmns
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
}